

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::Identification::Identification(Identification *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UUID *pUVar3;
  MDDEntry *pMVar4;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Identification_00224cf0;
  (this->ThisGenerationUID).super_Identifier<16U>.m_HasValue = false;
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[0] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[1] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[2] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[3] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[4] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[5] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->ThisGenerationUID;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->ThisGenerationUID).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00223d80;
  (this->CompanyName).super_string._M_dataplus._M_p =
       (pointer)&(this->CompanyName).super_string.field_2;
  (this->CompanyName).super_string._M_string_length = 0;
  (this->CompanyName).super_string.field_2._M_local_buf[0] = '\0';
  (this->CompanyName).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_002239d0;
  (this->ProductName).super_string._M_dataplus._M_p =
       (pointer)&(this->ProductName).super_string.field_2;
  (this->ProductName).super_string._M_string_length = 0;
  (this->ProductName).super_string.field_2._M_local_buf[0] = '\0';
  (this->ProductName).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_002239d0;
  (this->ProductVersion).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_002276e0;
  (this->ProductVersion).Major = 0;
  (this->ProductVersion).Minor = 0;
  (this->ProductVersion).Patch = 0;
  (this->ProductVersion).Build = 0;
  (this->ProductVersion).Release = RL_UNKNOWN;
  (this->VersionString).super_string._M_dataplus._M_p =
       (pointer)&(this->VersionString).super_string.field_2;
  (this->VersionString).super_string._M_string_length = 0;
  (this->VersionString).super_string.field_2._M_local_buf[0] = '\0';
  (this->VersionString).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_002239d0;
  (this->ProductUID).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_HasValue = false;
  (this->ProductUID).super_Identifier<16U>.m_Value[0] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[1] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[2] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[3] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[4] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[5] = '\0';
  (this->ProductUID).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->ProductUID;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->ProductUID).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00223d80;
  Kumu::Timestamp::Timestamp(&this->ModificationDate);
  (this->ToolkitVersion).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_002276e0;
  (this->ToolkitVersion).Major = 0;
  (this->ToolkitVersion).Minor = 0;
  (this->ToolkitVersion).Patch = 0;
  (this->ToolkitVersion).Build = 0;
  (this->ToolkitVersion).Release = RL_UNKNOWN;
  (this->Platform).m_property.super_string._M_dataplus._M_p =
       (pointer)&(this->Platform).m_property.super_string.field_2;
  (this->Platform).m_property.super_string._M_string_length = 0;
  (this->Platform).m_property.super_string.field_2._M_local_buf[0] = '\0';
  (this->Platform).m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__UTF16String_002239d0;
  (this->Platform).m_has_value = false;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_Identification);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xa3,"ASDCP::MXF::Identification::Identification(const Dictionary *)");
}

Assistant:

Identification::Identification(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Identification);
}